

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::ConstraintsBiReset(ChLinkLock *this)

{
  ChLinkLimit *pCVar1;
  ChConstraintTwoBodies *pCVar2;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < (this->mask).super_ChLinkMask.nconstr; i_00 = i_00 + 1) {
    pCVar2 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,i_00);
    (pCVar2->super_ChConstraintTwo).super_ChConstraint.b_i = 0.0;
  }
  pCVar1 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar1 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar1 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar1 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar1 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  pCVar1 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    if (*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x18) = 0.0;
    }
    if (*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c) == true) {
      *(double *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x18) = 0.0;
    }
  }
  return;
}

Assistant:

void ChLinkLock::ConstraintsBiReset() {
    for (int i = 0; i < mask.nconstr; i++) {
        mask.Constr_N(i).Set_b_i(0.);
    }

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            limit_X->constr_lower.Set_b_i(0.);
        }
        if (limit_X->constr_upper.IsActive()) {
            limit_X->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            limit_Y->constr_lower.Set_b_i(0.);
        }
        if (limit_Y->constr_upper.IsActive()) {
            limit_Y->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            limit_Z->constr_lower.Set_b_i(0.);
        }
        if (limit_Z->constr_upper.IsActive()) {
            limit_Z->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            limit_Rx->constr_lower.Set_b_i(0.);
        }
        if (limit_Rx->constr_upper.IsActive()) {
            limit_Rx->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            limit_Ry->constr_lower.Set_b_i(0.);
        }
        if (limit_Ry->constr_upper.IsActive()) {
            limit_Ry->constr_upper.Set_b_i(0.);
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            limit_Rz->constr_lower.Set_b_i(0.);
        }
        if (limit_Rz->constr_upper.IsActive()) {
            limit_Rz->constr_upper.Set_b_i(0.);
        }
    }
}